

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_session.cpp
# Opt level: O0

void __thiscall cab_session::~cab_session(cab_session *this)

{
  unsigned_short uVar1;
  cab_manager *this_00;
  ostream *poVar2;
  endpoint_type local_88;
  endpoint_type local_6c;
  address local_50;
  string local_30;
  cab_session *local_10;
  cab_session *this_local;
  
  local_10 = this;
  if (this->_cab != (cab *)0x0) {
    this_00 = application::manager(this->_application);
    cab_manager::remove(this_00,(char *)this->_cab);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Cab connection from ");
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::remote_endpoint(&local_6c,
                    &(this->_socket).
                     super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   );
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address(&local_50,&local_6c);
  boost::asio::ip::address::to_string_abi_cxx11_(&local_30,&local_50);
  poVar2 = std::operator<<(poVar2,(string *)&local_30);
  poVar2 = std::operator<<(poVar2,":");
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::remote_endpoint(&local_88,
                    &(this->_socket).
                     super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   );
  uVar1 = boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port(&local_88);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  std::operator<<(poVar2," closed\n");
  std::__cxx11::string::~string((string *)&local_30);
  std::function<void_()>::~function(&this->_handle_buffer);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->_buffer);
  boost::asio::
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~basic_stream_socket(&this->_socket);
  std::enable_shared_from_this<cab_session>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<cab_session>);
  return;
}

Assistant:

cab_session::~cab_session()
{
    if(_cab)
        _application->manager().remove(*_cab);

    std::cout << "Cab connection from " << this->_socket.remote_endpoint().address().to_string()
              << ":" << this->_socket.remote_endpoint().port() << " closed\n";
}